

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidierror.cpp
# Opt level: O0

int anon_unknown.dwarf_1c1da::RtMidiError_getmessage(lua_State *L)

{
  string *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_38 [8];
  string msg;
  RtMidiError *self;
  lua_State *L_local;
  
  msg.field_2._8_8_ = getRtMidiError(L,1);
  psVar1 = (string *)(**(code **)(*(long *)msg.field_2._8_8_ + 0x28))();
  std::__cxx11::string::string(local_38,psVar1);
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::size();
  lua_pushlstring(L,uVar2,uVar3);
  std::__cxx11::string::~string(local_38);
  return 1;
}

Assistant:

int RtMidiError_getmessage(lua_State *L) {
	auto &self = getRtMidiError(L, 1);
	auto msg = self.getMessage();
	lua_pushlstring(L, msg.c_str(), msg.size());
	return 1;
}